

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall
ddd::DaTrie<false,_false,_false>::shelter_
          (DaTrie<false,_false,_false> *this,uint32_t base,Edge *edge,Query *query)

{
  bool bVar1;
  uint uVar2;
  uint32_t node_pos_00;
  Edge *edge_00;
  Edge *pEVar3;
  reference pvVar4;
  Edge *in_RDX;
  uint in_ESI;
  vector<ddd::Bc,_std::allocator<ddd::Bc>_> *in_RDI;
  uint32_t _base;
  Query *in_stack_00000018;
  Edge *in_stack_00000020;
  uint32_t node_pos;
  uint32_t child_pos;
  uint32_t in_stack_0000002c;
  uint8_t label;
  uint8_t *__end2;
  uint8_t *__begin2;
  Edge *__range2;
  uint32_t ng_block;
  Edge _edge;
  uint32_t in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  Edge *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffeb4;
  Edge *this_00;
  Edge local_128;
  Edge *local_18;
  uint local_c;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  Edge::Edge(&local_128);
  edge_00 = (Edge *)Edge::begin(local_18);
  pEVar3 = (Edge *)Edge::end(local_18);
  this_00 = local_18;
  for (; edge_00 != pEVar3; edge_00 = (Edge *)(edge_00->labels_ + 1)) {
    in_stack_fffffffffffffeb4 = CONCAT13(edge_00->labels_[0],(int3)in_stack_fffffffffffffeb4);
    uVar2 = local_c ^ edge_00->labels_[0];
    pvVar4 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)uVar2);
    bVar1 = Bc::is_fixed(pvVar4);
    if (bVar1) {
      pvVar4 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)uVar2);
      node_pos_00 = Bc::check(pvVar4);
      edge_((DaTrie<false,_false,_false> *)CONCAT44(in_stack_fffffffffffffeb4,uVar2),node_pos_00,
            in_stack_fffffffffffffea0,CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98))
      ;
      in_stack_fffffffffffffe98 =
           xcheck_((DaTrie<false,_false,_false> *)this_00,edge_00,(uint32_t)((ulong)pEVar3 >> 0x20),
                   (vector<ddd::Block,_std::allocator<ddd::Block>_> *)
                   CONCAT44(in_stack_fffffffffffffeb4,uVar2));
      move_((DaTrie<false,_false,_false> *)__end2,in_stack_0000002c,child_pos,in_stack_00000020,
            in_stack_00000018);
    }
  }
  Edge::~Edge(&local_128);
  return;
}

Assistant:

void shelter_(uint32_t base, const Edge& edge, Query& query) {
    Edge _edge;
    auto ng_block = base / BLOCK_SIZE;

    for (auto label : edge) {
      auto child_pos = base ^label;
      if (bc_[child_pos].is_fixed()) {
        auto node_pos = bc_[child_pos].check();
        edge_(node_pos, _edge);

        auto _base = xcheck_(_edge, ng_block, blocks_);
        move_(node_pos, _base, _edge, query);
      }
    }
  }